

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.cpp
# Opt level: O2

bool generate_event(void)

{
  FILE *__s;
  
  __s = fopen("/sys/bus/iio/devices/iio_evgen/poke_ev0","w");
  if (__s != (FILE *)0x0) {
    fwrite("1\n",2,1,__s);
    fclose(__s);
  }
  return __s != (FILE *)0x0;
}

Assistant:

bool
generate_event()
{
    FILE* fp = fopen("/sys/bus/iio/devices/iio_evgen/poke_ev0", "w");
    if (fp == NULL)
        return false;
    fprintf(fp, "1\n");
    fclose(fp);
    return true;
}